

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::UpdateHoveredWindowAndCaptureFlags(void)

{
  double *pdVar1;
  float fVar2;
  float fVar3;
  ImVec2 IVar4;
  double dVar5;
  bool bVar6;
  short sVar7;
  float fVar8;
  int iVar9;
  ImGuiWindow *pIVar10;
  ImGuiContext *pIVar11;
  undefined1 uVar12;
  uint uVar13;
  ImGuiWindow *pIVar14;
  ImGuiViewportP *pIVar15;
  ImGuiWindow *pIVar16;
  byte bVar17;
  float fVar18;
  float fVar19;
  byte bVar20;
  byte bVar21;
  long lVar22;
  ulong uVar23;
  byte bVar24;
  ImGuiWindow *pIVar25;
  ImGuiWindow *pIVar26;
  byte bVar27;
  int iVar28;
  bool bVar29;
  bool bVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar33 [16];
  float fVar34;
  
  pIVar11 = GImGui;
  IVar4 = (GImGui->Style).TouchExtraPadding;
  fVar31 = IVar4.x;
  fVar32 = IVar4.y;
  auVar33._8_8_ = 0;
  auVar33._0_4_ = IVar4.x;
  auVar33._4_4_ = IVar4.y;
  auVar33 = maxps(auVar33,_DAT_001a71f0);
  GImGui->WindowsHoverPadding = auVar33._0_8_;
  pIVar14 = pIVar11->MovingWindow;
  if (pIVar14 == (ImGuiWindow *)0x0) {
    pIVar15 = (ImGuiViewportP *)0x0;
    pIVar26 = (ImGuiWindow *)0x0;
  }
  else {
    pIVar15 = pIVar14->Viewport;
    pIVar14->Viewport = pIVar11->MouseViewport;
    pIVar26 = (ImGuiWindow *)0x0;
    if ((pIVar14->Flags & 0x200) == 0) {
      pIVar26 = pIVar14;
    }
    fVar31 = (pIVar11->Style).TouchExtraPadding.x;
    fVar32 = (pIVar11->Style).TouchExtraPadding.y;
  }
  fVar19 = fVar31;
  fVar8 = fVar32;
  if ((pIVar11->IO).ConfigWindowsResizeFromEdges == true) {
    fVar19 = (pIVar11->WindowsHoverPadding).x;
    fVar8 = (pIVar11->WindowsHoverPadding).y;
  }
  lVar22 = (long)(pIVar11->Windows).Size;
  if (lVar22 < 1) {
    pIVar16 = (ImGuiWindow *)0x0;
  }
  else {
    uVar23 = lVar22 + 1;
    pIVar16 = (ImGuiWindow *)0x0;
    do {
      pIVar10 = (pIVar11->Windows).Data[uVar23 - 2];
      if (((pIVar10->Active == true) && (pIVar10->Hidden == false)) &&
         (uVar13 = pIVar10->Flags, (uVar13 >> 9 & 1) == 0)) {
        if (pIVar10->Viewport == (ImGuiViewportP *)0x0) {
          __assert_fail("window->Viewport",
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                        ,0x1311,"void FindHoveredWindow()");
        }
        if (pIVar10->Viewport == pIVar11->MouseViewport) {
          fVar34 = fVar31;
          if ((uVar13 & 0x1000042) == 0) {
            fVar34 = fVar19;
          }
          fVar2 = (pIVar11->IO).MousePos.x;
          if ((pIVar10->OuterRectClipped).Min.x - fVar34 <= fVar2) {
            fVar18 = fVar32;
            if ((uVar13 & 0x1000042) == 0) {
              fVar18 = fVar8;
            }
            fVar3 = (pIVar11->IO).MousePos.y;
            if (((((pIVar10->OuterRectClipped).Min.y - fVar18 <= fVar3) &&
                 (fVar2 < fVar34 + (pIVar10->OuterRectClipped).Max.x)) &&
                (fVar3 < fVar18 + (pIVar10->OuterRectClipped).Max.y)) &&
               (((sVar7 = (pIVar10->HitTestHoleSize).x, sVar7 == 0 ||
                 (fVar34 = (float)(int)(pIVar10->HitTestHoleOffset).x + (pIVar10->Pos).x,
                 fVar2 < fVar34)) ||
                ((fVar34 + (float)(int)sVar7 <= fVar2 ||
                 ((fVar34 = (float)(int)(pIVar10->HitTestHoleOffset).y + (pIVar10->Pos).y,
                  fVar3 < fVar34 || (fVar34 + (float)(int)(pIVar10->HitTestHoleSize).y <= fVar3)))))
                ))) {
              if (pIVar26 == (ImGuiWindow *)0x0) {
                pIVar26 = pIVar10;
              }
              pIVar25 = pIVar10;
              if (pIVar16 != (ImGuiWindow *)0x0) {
                pIVar25 = pIVar16;
              }
              if (((pIVar14 == (ImGuiWindow *)0x0) || (pIVar16 != (ImGuiWindow *)0x0)) ||
                 (pIVar25 = pIVar10, pIVar10->RootWindowDockTree != pIVar14->RootWindowDockTree)) {
                pIVar16 = pIVar25;
                if (pIVar26 != (ImGuiWindow *)0x0) break;
                pIVar26 = (ImGuiWindow *)0x0;
              }
              else {
                pIVar16 = (ImGuiWindow *)0x0;
              }
            }
          }
        }
      }
      uVar23 = uVar23 - 1;
    } while (1 < uVar23);
  }
  pIVar11->HoveredWindow = pIVar26;
  pIVar11->HoveredWindowUnderMovingWindow = pIVar16;
  if (pIVar14 != (ImGuiWindow *)0x0) {
    pIVar14->Viewport = pIVar15;
  }
  if (pIVar26 == (ImGuiWindow *)0x0) {
    pIVar14 = GetTopMostPopupModal();
    bVar29 = pIVar14 != (ImGuiWindow *)0x0;
  }
  else {
    if ((pIVar26 != pIVar14) && (pIVar26->Viewport != pIVar11->MouseViewport)) {
      __assert_fail("g.HoveredWindow == __null || g.HoveredWindow == g.MovingWindow || g.HoveredWindow->Viewport == g.MouseViewport"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0xfb5,"void ImGui::UpdateHoveredWindowAndCaptureFlags()");
    }
    pIVar14 = GetTopMostPopupModal();
    if (pIVar14 == (ImGuiWindow *)0x0) {
      bVar29 = false;
    }
    else {
      pIVar16 = pIVar26->RootWindowDockTree;
      pIVar10 = pIVar16->RootWindow->RootWindowPopupTree->RootWindowDockTree;
      bVar30 = true;
      bVar29 = true;
      if (pIVar10 != pIVar14) {
        do {
          bVar29 = pIVar16 != pIVar14;
          if ((pIVar16 == pIVar10) || (pIVar16 == pIVar14)) break;
          pIVar16 = pIVar16->ParentWindow;
        } while (pIVar16 != (ImGuiWindow *)0x0);
        goto LAB_00127f0f;
      }
    }
  }
  bVar30 = bVar29;
  bVar29 = false;
LAB_00127f0f:
  uVar13 = (pIVar11->IO).ConfigFlags;
  iVar9 = (pIVar11->OpenPopupStack).Size;
  iVar28 = -1;
  lVar22 = 0;
  bVar20 = 0;
  do {
    if ((pIVar11->IO).MouseClicked[lVar22] == true) {
      (pIVar11->IO).MouseDownOwned[lVar22] = 0 < iVar9 || pIVar26 != (ImGuiWindow *)0x0;
      (pIVar11->IO).MouseDownOwnedUnlessPopupClose[lVar22] =
           (bool)(pIVar26 != (ImGuiWindow *)0x0 | bVar30);
    }
    bVar6 = (pIVar11->IO).MouseDown[lVar22];
    if ((bVar6 == true) &&
       ((iVar28 == -1 ||
        (dVar5 = (pIVar11->IO).MouseClickedTime[iVar28],
        pdVar1 = (pIVar11->IO).MouseClickedTime + lVar22, *pdVar1 <= dVar5 && dVar5 != *pdVar1)))) {
      iVar28 = (int)lVar22;
    }
    bVar20 = bVar20 & 1 | bVar6;
    lVar22 = lVar22 + 1;
  } while (lVar22 != 5);
  bVar27 = 1;
  bVar24 = 1;
  bVar21 = 1;
  if (iVar28 != -1) {
    bVar24 = (pIVar11->IO).MouseDownOwned[iVar28];
    bVar21 = (pIVar11->IO).MouseDownOwnedUnlessPopupClose[iVar28];
  }
  bVar17 = (byte)((uVar13 & 0x10) >> 4) | bVar29;
  if (pIVar11->DragDropActive == true) {
    bVar27 = (pIVar11->DragDropSourceFlags & 0x10U) == 0 | bVar17;
  }
  if (bVar24 != 0) {
    bVar27 = bVar17;
  }
  if (bVar27 != 0) {
    pIVar11->HoveredWindow = (ImGuiWindow *)0x0;
    pIVar11->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
    pIVar26 = (ImGuiWindow *)0x0;
  }
  if (pIVar11->WantCaptureMouseNextFrame == -1) {
    bVar29 = pIVar26 != (ImGuiWindow *)0x0 || bVar20 != 0;
    (pIVar11->IO).WantCaptureMouse = (bool)(bVar24 & bVar29 | 0 < iVar9);
    bVar29 = (bool)(bVar21 & bVar29 | bVar30);
    lVar22 = 0x3b8;
  }
  else {
    bVar29 = pIVar11->WantCaptureMouseNextFrame != 0;
    (pIVar11->IO).WantCaptureMouseUnlessPopupClose = bVar29;
    lVar22 = 0x390;
  }
  *(bool *)((long)(pIVar11->IO).KeyMap + lVar22 + -0x3c) = bVar29;
  if (pIVar11->WantCaptureKeyboardNextFrame == -1) {
    bVar30 = (bool)(bVar30 | pIVar11->ActiveId != 0);
  }
  else {
    bVar30 = pIVar11->WantCaptureKeyboardNextFrame != 0;
  }
  uVar13 = uVar13 & 9;
  uVar12 = (char)uVar13;
  if (uVar13 != 1) {
    uVar12 = bVar30;
  }
  if ((pIVar11->IO).NavActive == false) {
    uVar12 = bVar30;
  }
  (pIVar11->IO).WantCaptureKeyboard = (bool)uVar12;
  (pIVar11->IO).WantTextInput = pIVar11->WantTextInputNextFrame - 1U < 0xfffffffe;
  return;
}

Assistant:

void ImGui::UpdateHoveredWindowAndCaptureFlags()
{
    ImGuiContext& g = *GImGui;
    ImGuiIO& io = g.IO;
    g.WindowsHoverPadding = ImMax(g.Style.TouchExtraPadding, ImVec2(WINDOWS_HOVER_PADDING, WINDOWS_HOVER_PADDING));

    // Find the window hovered by mouse:
    // - Child windows can extend beyond the limit of their parent so we need to derive HoveredRootWindow from HoveredWindow.
    // - When moving a window we can skip the search, which also conveniently bypasses the fact that window->WindowRectClipped is lagging as this point of the frame.
    // - We also support the moved window toggling the NoInputs flag after moving has started in order to be able to detect windows below it, which is useful for e.g. docking mechanisms.
    bool clear_hovered_windows = false;
    FindHoveredWindow();
    IM_ASSERT(g.HoveredWindow == NULL || g.HoveredWindow == g.MovingWindow || g.HoveredWindow->Viewport == g.MouseViewport);

    // Modal windows prevents mouse from hovering behind them.
    ImGuiWindow* modal_window = GetTopMostPopupModal();
    if (modal_window && g.HoveredWindow && !IsWindowChildOf(g.HoveredWindow->RootWindowDockTree, modal_window, true, true))
        clear_hovered_windows = true;

    // Disabled mouse?
    if (io.ConfigFlags & ImGuiConfigFlags_NoMouse)
        clear_hovered_windows = true;

    // We track click ownership. When clicked outside of a window the click is owned by the application and
    // won't report hovering nor request capture even while dragging over our windows afterward.
    const bool has_open_popup = (g.OpenPopupStack.Size > 0);
    const bool has_open_modal = (modal_window != NULL);
    int mouse_earliest_down = -1;
    bool mouse_any_down = false;
    for (int i = 0; i < IM_ARRAYSIZE(io.MouseDown); i++)
    {
        if (io.MouseClicked[i])
        {
            io.MouseDownOwned[i] = (g.HoveredWindow != NULL) || has_open_popup;
            io.MouseDownOwnedUnlessPopupClose[i] = (g.HoveredWindow != NULL) || has_open_modal;
        }
        mouse_any_down |= io.MouseDown[i];
        if (io.MouseDown[i])
            if (mouse_earliest_down == -1 || io.MouseClickedTime[i] < io.MouseClickedTime[mouse_earliest_down])
                mouse_earliest_down = i;
    }
    const bool mouse_avail = (mouse_earliest_down == -1) || io.MouseDownOwned[mouse_earliest_down];
    const bool mouse_avail_unless_popup_close = (mouse_earliest_down == -1) || io.MouseDownOwnedUnlessPopupClose[mouse_earliest_down];

    // If mouse was first clicked outside of ImGui bounds we also cancel out hovering.
    // FIXME: For patterns of drag and drop across OS windows, we may need to rework/remove this test (first committed 311c0ca9 on 2015/02)
    const bool mouse_dragging_extern_payload = g.DragDropActive && (g.DragDropSourceFlags & ImGuiDragDropFlags_SourceExtern) != 0;
    if (!mouse_avail && !mouse_dragging_extern_payload)
        clear_hovered_windows = true;

    if (clear_hovered_windows)
        g.HoveredWindow = g.HoveredWindowUnderMovingWindow = NULL;

    // Update io.WantCaptureMouse for the user application (true = dispatch mouse info to Dear ImGui only, false = dispatch mouse to Dear ImGui + underlying app)
    // Update io.WantCaptureMouseAllowPopupClose (experimental) to give a chance for app to react to popup closure with a drag
    if (g.WantCaptureMouseNextFrame != -1)
    {
        io.WantCaptureMouse = io.WantCaptureMouseUnlessPopupClose = (g.WantCaptureMouseNextFrame != 0);
    }
    else
    {
        io.WantCaptureMouse = (mouse_avail && (g.HoveredWindow != NULL || mouse_any_down)) || has_open_popup;
        io.WantCaptureMouseUnlessPopupClose = (mouse_avail_unless_popup_close && (g.HoveredWindow != NULL || mouse_any_down)) || has_open_modal;
    }

    // Update io.WantCaptureKeyboard for the user application (true = dispatch keyboard info to Dear ImGui only, false = dispatch keyboard info to Dear ImGui + underlying app)
    if (g.WantCaptureKeyboardNextFrame != -1)
        io.WantCaptureKeyboard = (g.WantCaptureKeyboardNextFrame != 0);
    else
        io.WantCaptureKeyboard = (g.ActiveId != 0) || (modal_window != NULL);
    if (io.NavActive && (io.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard) && !(io.ConfigFlags & ImGuiConfigFlags_NavNoCaptureKeyboard))
        io.WantCaptureKeyboard = true;

    // Update io.WantTextInput flag, this is to allow systems without a keyboard (e.g. mobile, hand-held) to show a software keyboard if possible
    io.WantTextInput = (g.WantTextInputNextFrame != -1) ? (g.WantTextInputNextFrame != 0) : false;
}